

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Singleton.h
# Opt level: O0

void __thiscall
axl::sl::
ConstructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>_>
::operator()(ConstructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>_>
             *this,void *p)

{
  Module *this_00;
  BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>
  *p_00;
  Module *in_RSI;
  Ptr<axl::g::Finalizer> *in_stack_ffffffffffffffd0;
  Ptr<axl::g::Finalizer> *in_stack_ffffffffffffffe8;
  
  BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>
  ::BoxList((BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>
             *)0x1447a8);
  this_00 = g::getModule();
  p_00 = (BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>
          *)mem::allocate(0x1447bc);
  DestructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>_>
  ::DestructSingleton((DestructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>_>
                       *)this_00,p_00);
  rc::
  primeRefCount<axl::sl::DestructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::sl::StringRefBase<char,axl::sl::StringDetailsBase<char>>const&>>>
            ((DestructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>_>
              *)this_00,(FreeFunc *)p_00);
  rc::Ptr<axl::g::Finalizer>::
  Ptr<axl::sl::DestructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::sl::StringRefBase<char,axl::sl::StringDetailsBase<char>>const&>>>
            (in_stack_ffffffffffffffd0,
             (DestructSingleton<axl::sl::BoxList<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>_>
              *)&stack0xffffffffffffffe0);
  g::Module::addFinalizer(in_RSI,in_stack_ffffffffffffffe8);
  rc::Ptr<axl::g::Finalizer>::~Ptr((Ptr<axl::g::Finalizer> *)0x14480a);
  return;
}

Assistant:

void
	operator () (void* p) {
		new(p)T;
		g::getModule()->addFinalizer(AXL_RC_NEW_ARGS(Destruct, ((T*)p)));
	}